

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall LinearNE<2,_3,_0>::wakeup(LinearNE<2,_3,_0> *this,int i,int param_2)

{
  IntView<2> *pIVar1;
  int iVar2;
  
  if (i < this->sz) {
    Tint::operator=(&this->num_unfixed,(this->num_unfixed).v + -1);
    if (i < *(int *)&(this->super_Propagator).field_0x14) {
      pIVar1 = this->x;
      iVar2 = ((pIVar1[i].var)->min).v;
    }
    else {
      pIVar1 = (IntView<2> *)this->y;
      iVar2 = -((pIVar1[i].var)->min).v;
    }
    Tint64_t::operator=(&this->sum_fixed,(long)pIVar1[i].a * (long)iVar2 + (this->sum_fixed).v);
  }
  if (1 < (this->num_unfixed).v) {
    return;
  }
  Propagator::pushInQueue(&this->super_Propagator);
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}